

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O2

void __thiscall MyServerConnection::OnTick(MyServerConnection *this,uint64_t nowUsec)

{
  int iVar1;
  undefined1 auVar2 [16];
  uint16_t uVar3;
  uint i_1;
  long lVar4;
  uint i;
  uint uVar5;
  TonkStatus status;
  uint8_t data [2];
  undefined1 uStack_5a6;
  
  iVar1 = this->StatusLogCounter;
  this->StatusLogCounter = iVar1 + 1;
  if (0x62 < iVar1) {
    this->StatusLogCounter = 0;
    test::LogTonkStatus(&this->super_SDKConnection);
  }
  tonk::SDKConnection::GetStatus(&status,&this->super_SDKConnection);
  data[0] = 200;
  OnTick::counter = OnTick::counter + '\x01';
  stack0xfffffffffffffa59 = CONCAT11(uStack_5a6,OnTick::counter);
  tonk::SDKConnection::Send(&this->super_SDKConnection,data,2,200);
  if ((ulong)status.LowPriQueueMsec < 0x32) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)status.AppBPS * (0x32 - (ulong)status.LowPriQueueMsec);
    for (uVar5 = 0; uVar5 != (SUB164(auVar2 / ZEXT816(1000),0) + 0x577U) / 0x578; uVar5 = uVar5 + 1)
    {
      memset(data,0,0x578);
      for (lVar4 = 0; lVar4 != 0x578; lVar4 = lVar4 + 1) {
        data[lVar4] = (uint8_t)lVar4;
      }
      uVar3 = tonk::SDKConnection::ToRemoteTime16(&this->super_SDKConnection,nowUsec);
      tonk::SDKConnection::ToRemoteTime23(&this->super_SDKConnection,nowUsec);
      data[0] = ((byte)status.Flags & 1) + 7;
      this->NextOutgoingWord = this->NextOutgoingWord + 1;
      unique0x100001a5 = uVar3;
      test::FunctionTimer::BeginCall((FunctionTimer *)test::t_tonk_send);
      tonk::SDKConnection::Send(&this->super_SDKConnection,data,0x578,0x98);
      test::FunctionTimer::EndCall((FunctionTimer *)test::t_tonk_send);
    }
  }
  return;
}

Assistant:

void MyServerConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    if (++StatusLogCounter >= 100)
    {
        StatusLogCounter = 0;
        LogTonkStatus(this);
    }

    TonkStatus status = GetStatus();

    {
        static uint8_t counter = 0;
        uint8_t data[2] = { 200, ++counter };
        Send(data, sizeof(data), TonkChannel_Unordered);
    }

#ifdef TONK_ENABLE_1MBPS_DATA_SERVER
    if (status.LowPriQueueMsec < kLowPriQueueDepthMsec)
    {
        unsigned fillMsec = kLowPriQueueDepthMsec - status.LowPriQueueMsec;
        unsigned bytes = (unsigned)(((uint64_t)status.AppBPS * fillMsec) / 1000);
        unsigned packetsToSend = (bytes + kLowPriBulkData_Bytes - 1) / kLowPriBulkData_Bytes;
        for (unsigned i = 0; i < packetsToSend; ++i)
        {
            uint8_t data[kLowPriBulkData_Bytes] = {};
            for (unsigned i = 0; i < kLowPriBulkData_Bytes; ++i) {
                data[i] = (uint8_t)i;
            }

            const uint16_t ts16 = ToRemoteTime16(nowUsec);
            const uint32_t ts23 = ToRemoteTime23(nowUsec);

            data[0] = (status.Flags & TonkFlag_TimeSync) ? ID_LowPriBulkData_HasTimestamp : ID_LowPriBulkData_NoTimestamp;
            tonk::WriteU16_LE(data + 1, ts16);
            tonk::WriteU24_LE(data + 1 + 2, ts23);
            tonk::WriteU24_LE(data + 1 + 2 + 3, kLowPriBulkMagic);
            tonk::WriteU32_LE(data + 1 + 2 + 3 + 3, NextOutgoingWord++);

            t_tonk_send.BeginCall();
            Send(data, sizeof(data), kLowPriBulkData_Channel);
            t_tonk_send.EndCall();
        }
    }
#endif
}